

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HashBlock * sha256(HashBlock *__return_storage_ptr__,string *message)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  pointer __x;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ws;
  vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> w;
  vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> blocks;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  local_a8;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  local_90;
  _Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> local_78;
  _Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> local_60;
  _Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> local_48;
  
  pad_parse((vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *)&local_48,
            (message->_M_dataplus)._M_p,(int)message->_M_string_length);
  std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::vector
            ((vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *)&local_60,
             (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *)&local_48);
  expand(&local_a8,(vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *)&local_60);
  std::_Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::~_Vector_base
            (&local_60);
  for (__x = local_a8.
             super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __x != local_a8.
             super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::vector
              ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)&local_78,__x);
    pbVar1 = local_78._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = local_78._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1;
        pbVar3 = pbVar3 + 1) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::_Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::~_Vector_base
              (&local_78);
  }
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::vector(&local_90,&local_a8);
  compress(__return_storage_ptr__,&local_90);
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::~vector(&local_90);
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::~vector(&local_a8);
  std::_Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::~_Vector_base
            (&local_48);
  return __return_storage_ptr__;
}

Assistant:

HashBlock sha256(string message) {
    auto blocks = pad_parse(message.c_str(), message.size());

    auto ws = expand(blocks);
    for (auto w:ws)
    {
        for (auto wi: w)
        {
            cout << wi.to_ulong() << endl;
        }
    }


    return compress(ws);
}